

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O1

ssize_t __thiscall inja::Environment::write(Environment *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  ofstream file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  undefined8 local_220;
  filebuf local_218 [240];
  ios_base local_128 [264];
  
  std::operator+(&local_240,
                 &((this->m_impl)._M_t.
                   super___uniq_ptr_impl<inja::Environment::Impl,_std::default_delete<inja::Environment::Impl>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_inja::Environment::Impl_*,_std::default_delete<inja::Environment::Impl>_>
                   .super__Head_base<0UL,_inja::Environment::Impl_*,_false>._M_head_impl)->
                  output_path,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__n);
  std::ofstream::ofstream(&local_220,(string *)&local_240,_S_out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p);
  }
  render(&local_240,this,(Template *)CONCAT44(in_register_00000034,__fd),(json *)__buf);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_220,local_240._M_dataplus._M_p,local_240._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p);
  }
  std::ofstream::close();
  local_220 = 0;
  *(undefined8 *)(local_218 + lRamffffffffffffffe8 + -8) = 0;
  std::filebuf::~filebuf(local_218);
  sVar1 = std::ios_base::~ios_base(local_128);
  return sVar1;
}

Assistant:

void write(const Template& temp, const json& data, const std::string& filename_out) {
		std::ofstream file(m_impl->output_path + filename_out);
		file << render(temp, data);
		file.close();
	}